

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O2

int main(void)

{
  uint uVar1;
  uint *puVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  CMUnitTest tests [68];
  
  puVar2 = (uint *)cpuid_Version_info(1);
  uVar6 = (ulong)puVar2[2];
  uVar4 = *puVar2 >> 4;
  uVar1 = uVar4 - 0x2065;
  if (10 < uVar1) {
LAB_0010687b:
    switch(uVar4) {
    case 0x1066:
switchD_00106a36_caseD_1066:
      pcVar7 = "Merom";
      goto LAB_00106b56;
    case 0x1067:
    case 0x106d:
      pcVar7 = "Penryn";
      goto LAB_00106b56;
    case 0x1068:
    case 0x1069:
    case 0x106b:
    case 0x106c:
switchD_00106a36_caseD_1068:
      pcVar7 = "unknown";
      goto LAB_00106b56;
    case 0x106a:
    case 0x106e:
      goto switchD_00106a36_caseD_106a;
    default:
      if (uVar4 - 99 < 2) {
        pcVar7 = "Prescott";
        goto LAB_00106b56;
      }
      if (uVar4 - 0x806c < 2) {
        pcVar7 = "TigerLake";
        goto LAB_00106b56;
      }
      if (uVar4 - 0xa065 < 2) {
        pcVar7 = "Cometlake";
        goto LAB_00106b56;
      }
      if (uVar4 == 0x66) {
        pcVar7 = "Presler";
        goto LAB_00106b56;
      }
      if (uVar4 == 0x6d) {
        pcVar7 = "Dothan";
        goto LAB_00106b56;
      }
      if (uVar4 == 0x6f) goto switchD_00106a36_caseD_1066;
      if (uVar4 == 0x16c) {
        pcVar7 = "Pineview";
        goto LAB_00106b56;
      }
      if (uVar4 == 0x266) {
        pcVar7 = "Lincroft";
        goto LAB_00106b56;
      }
      if (uVar4 == 0x366) {
        pcVar7 = "Cedarview";
        goto LAB_00106b56;
      }
      if (uVar4 == 0x306a) {
        pcVar7 = "IvyBridge";
        goto LAB_00106b56;
      }
      if (uVar4 == 0x306c) {
        pcVar7 = "Haswell";
        goto LAB_00106b56;
      }
      if (uVar4 == 0x306d) {
        pcVar7 = "Broadwell";
        goto LAB_00106b56;
      }
      if (uVar4 == 0x30f1) goto LAB_00106a44;
      if (uVar4 == 0x60f10) {
        pcVar7 = "Zen4";
        goto LAB_00106b56;
      }
      if (uVar4 == 0x506c) {
LAB_00106aa4:
        pcVar7 = "Goldmont";
        goto LAB_00106b56;
      }
      if (uVar4 == 0x506e) {
        pcVar7 = "Skylake";
        goto LAB_00106b56;
      }
      if (uVar4 == 0x606a) {
LAB_00106ab0:
        pcVar7 = "Icelake";
      }
      else {
        if ((uVar4 != 0x60f0) && (uVar4 != 0x60f8)) {
          if (uVar4 == 0x706a) goto LAB_00106aa4;
          if (uVar4 == 0x706e) goto LAB_00106ab0;
          if (uVar4 != 0x70f1) {
            if (uVar4 != 0x806e) {
              if ((uVar4 == 0x9067) || (uVar4 == 0x906a)) {
                pcVar7 = "Alderlake";
                goto LAB_00106b56;
              }
              if (uVar4 != 0x906e) {
                if (uVar4 != 0x90f0) {
                  if (uVar4 == 0xa067) {
                    pcVar7 = "Rocketlake";
                    goto LAB_00106b56;
                  }
                  if (uVar4 == 0xb067) {
                    pcVar7 = "Raptorlake";
                    goto LAB_00106b56;
                  }
                  if (uVar4 != 0x20f10) {
                    if (uVar4 == 0x40f40) {
                      pcVar7 = "Zen3+";
                      goto LAB_00106b56;
                    }
                    if (uVar4 != 0x50f00) {
                      if (uVar4 == 0x406c) {
                        pcVar7 = "CherryTrail";
                        goto LAB_00106b56;
                      }
                      goto switchD_00106a36_caseD_1068;
                    }
                  }
                  pcVar7 = "Zen3";
                  goto LAB_00106b56;
                }
                goto LAB_00106a44;
              }
            }
            pcVar7 = "Kabylake";
            goto LAB_00106b56;
          }
        }
LAB_00106a44:
        pcVar7 = "Zen2";
      }
      goto LAB_00106b56;
    }
  }
  uVar6 = 0x481;
  if ((0x481U >> (uVar1 & 0x1f) & 1) != 0) {
    pcVar7 = "Westmere";
    goto LAB_00106b56;
  }
  uVar6 = 0x120;
  if ((0x120U >> (uVar1 & 0x1f) & 1) != 0) {
    pcVar7 = "SandyBridge";
    goto LAB_00106b56;
  }
  if (uVar1 != 9) goto LAB_0010687b;
switchD_00106a36_caseD_106a:
  pcVar7 = "Nehalem";
LAB_00106b56:
  printf("x64 processor:  %s\t",pcVar7,uVar6);
  printf(" compiler version: %s\t",
         "Clang 19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
        );
  putchar(10);
  lVar3 = cpuid(0x80000006);
  if ((char)*(undefined4 *)(lVar3 + 0xc) != '@') {
    lVar3 = cpuid(0x80000006);
    printf("cache line: %d bytes\n",(ulong)(byte)*(undefined4 *)(lVar3 + 0xc),
           (ulong)*(uint *)(lVar3 + 8));
  }
  memcpy(tests,&PTR_anon_var_dwarf_e6d0_0014a2b0,0xaa0);
  iVar5 = _cmocka_run_group_tests("tests",tests,0x44,(CMFixtureFunction)0x0,(CMFixtureFunction)0x0);
  return iVar5;
}

Assistant:

int main() {
    roaring::misc::tellmeall();
    const struct CMUnitTest tests[] = {
        cmocka_unit_test(fuzz_001),
        cmocka_unit_test(test_bitmap_of_32),
        cmocka_unit_test(test_bitmap_of_64),
        cmocka_unit_test(serial_test),
#if !CROARING_IS_BIG_ENDIAN
        cmocka_unit_test(test_example_true),
        cmocka_unit_test(test_example_false),
        cmocka_unit_test(test_example_cpp_true),
        cmocka_unit_test(test_example_cpp_false),
        cmocka_unit_test(test_example_cpp_64_true),
        cmocka_unit_test(test_example_cpp_64_false),
#endif
        cmocka_unit_test(test_cpp_add_remove_checked),
        cmocka_unit_test(test_cpp_add_remove_checked_64),
        cmocka_unit_test(test_cpp_add_range),
        cmocka_unit_test(test_cpp_remove_range),
        cmocka_unit_test(test_cpp_add_range_closed_64),
        cmocka_unit_test(test_cpp_add_range_open_64),
        cmocka_unit_test(test_cpp_add_range_closed_large_64),
        cmocka_unit_test(test_cpp_add_range_open_large_64),
        cmocka_unit_test(test_cpp_add_many),
        cmocka_unit_test(test_cpp_add_many_64),
        cmocka_unit_test(test_cpp_add_range_closed_combinatoric_64),
        cmocka_unit_test(test_cpp_add_bulk),
        cmocka_unit_test(test_cpp_contains_bulk),
        cmocka_unit_test(test_cpp_rank_many),
        cmocka_unit_test(test_cpp_remove_range_closed_64),
        cmocka_unit_test(test_cpp_remove_range_64),
        cmocka_unit_test(test_run_compression_cpp_64_true),
        cmocka_unit_test(test_run_compression_cpp_64_false),
        cmocka_unit_test(test_run_compression_cpp_true),
        cmocka_unit_test(test_run_compression_cpp_false),
        cmocka_unit_test(test_cpp_union_64),
        cmocka_unit_test(test_cpp_intersect_64),
        cmocka_unit_test(test_cpp_difference_64),
        cmocka_unit_test(test_cpp_xor_64),
        cmocka_unit_test(test_cpp_clear_64),
        cmocka_unit_test(test_cpp_move_64),
        cmocka_unit_test(test_roaring64_iterate_multi_roaring),
        cmocka_unit_test(test_roaring64_remove_32),
        cmocka_unit_test(test_roaring64_add_and_remove),
        cmocka_unit_test(test_cpp_bidirectional_iterator_64),
        cmocka_unit_test(test_cpp_frozen),
        cmocka_unit_test(test_cpp_frozen_64),
        cmocka_unit_test(test_cpp_frozen_portable),
        cmocka_unit_test(test_cpp_frozen_64_portable),
        cmocka_unit_test(test_cpp_flip),
        cmocka_unit_test(test_cpp_flip_closed),
        cmocka_unit_test(test_cpp_flip_64),
        cmocka_unit_test(test_cpp_flip_closed_64),
        cmocka_unit_test(test_combinatoric_flip_many_64),
#if !CROARING_IS_BIG_ENDIAN
        cmocka_unit_test(test_cpp_deserialize_64_empty),
        cmocka_unit_test(test_cpp_deserialize_64_32bit_vals),
        cmocka_unit_test(test_cpp_deserialize_64_spread_vals),
        cmocka_unit_test(test_cpp_deserialize_64_high_vals),
        cmocka_unit_test(test_cpp_deserialize_add_offset),
#if ROARING_EXCEPTIONS
        cmocka_unit_test(test_cpp_deserialize_64_empty_input),
        cmocka_unit_test(test_cpp_deserialize_64_size_too_small),
        cmocka_unit_test(test_cpp_deserialize_64_invalid_size),
        cmocka_unit_test(test_cpp_deserialize_64_key_too_small),
#endif
#endif  // !CROARING_IS_BIG_ENDIAN
        cmocka_unit_test(issue316),
        cmocka_unit_test(test_issue304),
        cmocka_unit_test(issue_336),
        cmocka_unit_test(issue_372),
        cmocka_unit_test(test_cpp_is_subset_64),
        cmocka_unit_test(test_cpp_fast_union_64),
        cmocka_unit_test(test_cpp_to_string),
        cmocka_unit_test(test_cpp_remove_run_compression),
        cmocka_unit_test(test_cpp_contains_range_interleaved_containers),
        cmocka_unit_test(test_cpp_copy_map_iterator_to_different_map),
    };
    return cmocka_run_group_tests(tests, NULL, NULL);
}